

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O1

void adapt::cuf::detail::AddArg<int>
               (string *result,const_iterator *it,const_iterator *itend,int *arg)

{
  uint *puVar1;
  byte bVar2;
  byte *pbVar3;
  char mod;
  undefined8 *puVar4;
  long lVar5;
  uint uVar6;
  ostringstream str;
  byte local_1c1;
  long *local_1c0;
  long local_1b0 [2];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  mod = Parse((ostream *)local_1a0,it,itend);
  pbVar3 = (byte *)it->_M_current;
  if (pbVar3 == (byte *)itend->_M_current) goto LAB_0010d89a;
  it->_M_current = (char *)(pbVar3 + 1);
  bVar2 = *pbVar3;
  if (bVar2 < 0x58) {
    if (bVar2 == 0x41) {
      puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
      *puVar1 = *puVar1 | 0x104;
    }
    else if (bVar2 == 0x45) {
      *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 0x100;
    }
    else {
      if (bVar2 != 0x47) goto switchD_0010d6bb_caseD_68;
      puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
      *puVar1 = *puVar1 & 0xfffffefb;
    }
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    goto LAB_0010d88a;
  }
  switch(bVar2) {
  case 0x61:
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 0x104;
    goto LAB_0010d88a;
  case 0x62:
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    std::ostream::_M_insert<bool>(SUB81(local_1a0,0));
    break;
  case 99:
    local_1c1 = (byte)*arg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_1c1,1);
    break;
  case 100:
  case 0x69:
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 2;
    WriteInt<int>((ostringstream *)local_1a0,arg,mod);
    break;
  case 0x65:
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    uVar6 = *(uint *)((long)auStack_188 + lVar5) & 0xfffffefb | 0x100;
    goto LAB_0010d886;
  case 0x66:
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    uVar6 = *(uint *)((long)auStack_188 + lVar5) & 0xfffffefb | 4;
LAB_0010d886:
    *(uint *)((long)auStack_188 + lVar5) = uVar6;
    goto LAB_0010d88a;
  case 0x67:
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffefb;
LAB_0010d88a:
    WriteFloat<int>((ostringstream *)local_1a0,arg,mod);
    break;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0010d6bb_caseD_68:
    local_1c1 = bVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_1c1,1);
    break;
  case 0x6f:
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    uVar6 = *(uint *)((long)auStack_188 + lVar5) & 0xffffffb5 | 0x40;
    goto LAB_0010d85b;
  case 0x73:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::__cxx11::string::pop_back;
    __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
  case 0x75:
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    uVar6 = *(uint *)((long)auStack_188 + lVar5) & 0xffffffb5 | 2;
    goto LAB_0010d85b;
  case 0x78:
    lVar5 = *(long *)(local_1a0[0] + -0x18);
    uVar6 = *(uint *)((long)auStack_188 + lVar5) & 0xffffffb5 | 8;
LAB_0010d85b:
    *(uint *)((long)auStack_188 + lVar5) = uVar6;
LAB_0010d85f:
    WriteUnsignedInt<int>((ostringstream *)local_1a0,arg,mod);
    break;
  default:
    if (bVar2 != 0x58) goto switchD_0010d6bb_caseD_68;
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    goto LAB_0010d85f;
  }
LAB_0010d89a:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)result,(ulong)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void AddArg(std::string& result, std::string::const_iterator& it, const std::string::const_iterator& itend, const Value& arg)
{
	std::ostringstream str;
	try
	{
		char mod = 0;
		mod = Parse(str, it, itend);
		if (it != itend)
		{
			char type = *it++;
			switch (type)
			{
			case 'd':
			case 'i':
				str << std::dec;
				WriteInt(str, arg, mod);
				break;
			case 'u':
				str << std::dec;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'o':
				str << std::oct;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'x':
				str << std::hex;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'X':
				str << std::hex << std::uppercase;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'f':
				str << std::fixed;
				WriteFloat(str, arg, mod);
				break;
			case 'e':
				str << std::scientific;
				WriteFloat(str, arg, mod);
				break;
			case 'E':
				str << std::scientific << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'g':
				str << std::defaultfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'G':
				str << std::defaultfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'a':
				str << std::hexfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'A':
				str << std::hexfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 's':
				WriteAnyString(str, arg);
				break;
			case 'c':
				Write<char>(str, arg);
				break;
			case 'b':
				str << std::boolalpha;
				Write<bool>(str, arg);
				break;
			default:
				str << type;
			}
		}
	}
	catch (const std::exception&)
	{
		str << "!TYPE_MISMATCH!";
	}
	result += str.str();
}